

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferMemoryAliasing.cpp
# Opt level: O0

void vkt::sparse::addBufferSparseMemoryAliasingTests(TestCaseGroup *group)

{
  TestNode *pTVar1;
  BufferSparseMemoryAliasingCase *pBVar2;
  TestContext *pTVar3;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  undefined1 local_1aa;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  undefined1 local_15a;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  undefined1 local_10a;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  undefined1 local_ba;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6a;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  TestNode *local_10;
  TestCaseGroup *group_local;
  
  local_10 = &group->super_TestNode;
  pBVar2 = (BufferSparseMemoryAliasingCase *)operator_new(0x78);
  local_6a = 1;
  pTVar3 = tcu::TestNode::getTestContext(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"buffer_size_2_10",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  anon_unknown_0::BufferSparseMemoryAliasingCase::BufferSparseMemoryAliasingCase
            (pBVar2,pTVar3,&local_40,&local_68,0x400,GLSL_VERSION_440);
  local_6a = 0;
  tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pTVar1 = local_10;
  pBVar2 = (BufferSparseMemoryAliasingCase *)operator_new(0x78);
  local_ba = 1;
  pTVar3 = tcu::TestNode::getTestContext(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"buffer_size_2_12",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
  anon_unknown_0::BufferSparseMemoryAliasingCase::BufferSparseMemoryAliasingCase
            (pBVar2,pTVar3,&local_90,&local_b8,0x1000,GLSL_VERSION_440);
  local_ba = 0;
  tcu::TestNode::addChild(pTVar1,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  pTVar1 = local_10;
  pBVar2 = (BufferSparseMemoryAliasingCase *)operator_new(0x78);
  local_10a = 1;
  pTVar3 = tcu::TestNode::getTestContext(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"buffer_size_2_16",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_109);
  anon_unknown_0::BufferSparseMemoryAliasingCase::BufferSparseMemoryAliasingCase
            (pBVar2,pTVar3,&local_e0,&local_108,0x10000,GLSL_VERSION_440);
  local_10a = 0;
  tcu::TestNode::addChild(pTVar1,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pTVar1 = local_10;
  pBVar2 = (BufferSparseMemoryAliasingCase *)operator_new(0x78);
  local_15a = 1;
  pTVar3 = tcu::TestNode::getTestContext(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"buffer_size_2_17",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"",&local_159);
  anon_unknown_0::BufferSparseMemoryAliasingCase::BufferSparseMemoryAliasingCase
            (pBVar2,pTVar3,&local_130,&local_158,0x20000,GLSL_VERSION_440);
  local_15a = 0;
  tcu::TestNode::addChild(pTVar1,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  pTVar1 = local_10;
  pBVar2 = (BufferSparseMemoryAliasingCase *)operator_new(0x78);
  local_1aa = 1;
  pTVar3 = tcu::TestNode::getTestContext(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"buffer_size_2_20",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"",&local_1a9);
  anon_unknown_0::BufferSparseMemoryAliasingCase::BufferSparseMemoryAliasingCase
            (pBVar2,pTVar3,&local_180,&local_1a8,0x100000,GLSL_VERSION_440);
  local_1aa = 0;
  tcu::TestNode::addChild(pTVar1,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  pTVar1 = local_10;
  pBVar2 = (BufferSparseMemoryAliasingCase *)operator_new(0x78);
  pTVar3 = tcu::TestNode::getTestContext(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"buffer_size_2_24",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_1f9);
  anon_unknown_0::BufferSparseMemoryAliasingCase::BufferSparseMemoryAliasingCase
            (pBVar2,pTVar3,&local_1d0,&local_1f8,0x1000000,GLSL_VERSION_440);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  return;
}

Assistant:

void addBufferSparseMemoryAliasingTests(tcu::TestCaseGroup* group)
{
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_10", "", 1 << 10, glu::GLSL_VERSION_440));
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_12", "", 1 << 12, glu::GLSL_VERSION_440));
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_16", "", 1 << 16, glu::GLSL_VERSION_440));
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_17", "", 1 << 17, glu::GLSL_VERSION_440));
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_20", "", 1 << 20, glu::GLSL_VERSION_440));
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_24", "", 1 << 24, glu::GLSL_VERSION_440));
}